

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess.cpp
# Opt level: O0

void __thiscall QProcessPrivate::_q_processDied(QProcessPrivate *this)

{
  long in_RDI;
  
  _q_canReadStandardOutput((QProcessPrivate *)0x79037c);
  _q_canReadStandardError((QProcessPrivate *)0x790386);
  if (*(char *)(in_RDI + 0x2a4) != '\0') {
    processFinished(this);
  }
  return;
}

Assistant:

void QProcessPrivate::_q_processDied()
{
#if defined QPROCESS_DEBUG
    qDebug("QProcessPrivate::_q_processDied()");
#endif

    // in case there is data in the pipeline and this slot by chance
    // got called before the read notifications, call these functions
    // so the data is made available before we announce death.
#ifdef Q_OS_WIN
    drainOutputPipes();
#else
    _q_canReadStandardOutput();
    _q_canReadStandardError();
#endif

    // Slots connected to signals emitted by the functions called above
    // might call waitFor*(), which would synchronously reap the process.
    // So check the state to avoid trying to reap a second time.
    if (processState != QProcess::NotRunning)
        processFinished();
}